

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  connectdata *conn_00;
  IMAP *pIVar1;
  SMTP *smtp;
  connectdata *conn;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    (*Curl_cfree)(pIVar1->mailbox);
    pIVar1->mailbox = (char *)0x0;
    if (status == CURLE_OK) {
      if ((((*(ulong *)&(data->set).field_0x89c & 1) == 0) &&
          ((data->set).mail_rcpt != (curl_slist *)0x0)) &&
         (((*(uint *)&(data->state).field_0x7be >> 0x13 & 1) != 0 ||
          ((data->set).mimepost.kind != MIMEKIND_NONE)))) {
        smtp_state(data,SMTP_POSTDATA);
        conn._4_4_ = smtp_block_statemach(data,conn_00,false);
      }
    }
    else {
      Curl_conncontrol(conn_00,1);
      conn._4_4_ = status;
    }
    pIVar1->transfer = PPTRANSFER_BODY;
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
        (0 < Curl_trc_feat_smtp.log_level)))) {
      Curl_trc_smtp(data,"smtp_done(status=%d, premature=%d) -> %d",(ulong)status,(ulong)premature,
                    (ulong)conn._4_4_);
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;

  (void)premature;

  if(!smtp)
    return CURLE_OK;

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.mail_rcpt &&
          (data->state.upload || IS_MIME_POST(data))) {

    smtp_state(data, SMTP_POSTDATA);

    /* Run the state-machine */
    result = smtp_block_statemach(data, conn, FALSE);
  }

  /* Clear the transfer mode for the next request */
  smtp->transfer = PPTRANSFER_BODY;
  CURL_TRC_SMTP(data, "smtp_done(status=%d, premature=%d) -> %d",
                status, premature, result);
  return result;
}